

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-multiple-loops.c
# Opt level: O1

void signal2_cb(uv_signal_t *handle,int signum)

{
  int iVar1;
  
  if (signum == 0xc) {
    uv_mutex_lock(&counter_lock);
    signal2_cb_counter = signal2_cb_counter + 1;
    uv_mutex_unlock(&counter_lock);
    uv_signal_stop(handle);
    return;
  }
  signal2_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void signal2_cb(uv_signal_t* handle, int signum) {
  ASSERT(signum == SIGUSR2);
  increment_counter(&signal2_cb_counter);
  uv_signal_stop(handle);
}